

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

Status __thiscall google::protobuf::json_internal::JsonLexer::SkipValue(JsonLexer *this)

{
  int *piVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  Status *_status;
  JsonLexer *in_RSI;
  string_view literal;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  char *local_100;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>_1
  local_f8;
  undefined4 local_f0;
  JsonLocation *local_e8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_e0 [11];
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  local_88;
  
  PeekKind((JsonLexer *)&local_f8.status_);
  (this->stream_).stream_ = (ZeroCopyInputStream *)local_f8;
  if (((ulong)local_f8 & 1) == 0) {
    LOCK();
    *(int *)local_f8 = *(int *)local_f8 + 1;
    UNLOCK();
  }
  if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
  if (local_f8 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>_1)
      0x1) {
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
LAB_002bf5a6:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0[0].status_);
switchD_002bf18f_default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/lexer.cc"
               ,0xa5,5,"false");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_e0[0].status_,(char (*) [12])"unreachable");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e0[0].status_);
  }
  switch(local_f0) {
  case 0:
    Expect(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
    iVar2 = (in_RSI->options_).recursion_depth;
    if (iVar2 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&in_RSI->json_loc_,0x22,"JSON content was too deeply nested");
    }
    else {
      (in_RSI->options_).recursion_depth = iVar2 + -1;
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
    absl::lts_20240722::Status::~Status((Status *)this);
    literal._M_str = "}";
    literal._M_len = 1;
    bVar4 = Peek(in_RSI,literal);
    if (bVar4) goto LAB_002bf4e4;
    local_e8 = &in_RSI->json_loc_;
    bVar4 = true;
    local_100 = "expected \',\'";
    do {
      if (bVar4 == false) goto LAB_002bf564;
      SkipToToken(this);
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
      absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_e0[0].status_);
      cVar3 = ZeroCopyBufferedStream::PeekChar(&in_RSI->stream_);
      if ((cVar3 == '\"') ||
         (cVar3 = ZeroCopyBufferedStream::PeekChar(&in_RSI->stream_), cVar3 == '\'')) {
        ParseUtf8((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_88,in_RSI);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_e0[0].status_,&local_88);
LAB_002bf38f:
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData(&local_88);
        (this->stream_).stream_ = (ZeroCopyInputStream *)local_e0[0];
        if (((ulong)local_e0[0] & 1) == 0) {
          LOCK();
          *(int *)local_e0[0] = *(int *)local_e0[0] + 1;
          UNLOCK();
        }
        if (((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) ||
           (Expect(this), (this->stream_).stream_ != (ZeroCopyInputStream *)0x1)) goto LAB_002bf455;
        absl::lts_20240722::Status::~Status((Status *)this);
        if (local_e0[0] !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) goto LAB_002bf5a6;
        SkipValue(this);
        if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf455;
        absl::lts_20240722::Status::~Status((Status *)this);
        literal_00._M_str = ",";
        literal_00._M_len = 1;
        bVar4 = Peek(in_RSI,literal_00);
        bVar5 = true;
      }
      else {
        if ((in_RSI->options_).allow_legacy_syntax == true) {
          ParseBareWord((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_88,in_RSI);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_e0[0].status_,&local_88);
          goto LAB_002bf38f;
        }
        JsonLocation::Invalid((JsonLocation *)this,local_e8,0xc,"expected \'\"\'");
LAB_002bf455:
        bVar5 = false;
      }
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_e0[0].status_);
      if (!bVar5) goto LAB_002bf57d;
      literal_01._M_str = "}";
      literal_01._M_len = 1;
      bVar5 = Peek(in_RSI,literal_01);
    } while (!bVar5);
    piVar1 = &(in_RSI->options_).recursion_depth;
    *piVar1 = *piVar1 + 1;
    if (((in_RSI->options_).allow_legacy_syntax == false) && (bVar4 != false)) {
      local_100 = "expected \'}\'";
      goto LAB_002bf564;
    }
    goto LAB_002bf4e8;
  case 1:
    Expect(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
    iVar2 = (in_RSI->options_).recursion_depth;
    if (iVar2 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&in_RSI->json_loc_,0x22,"JSON content was too deeply nested");
    }
    else {
      (in_RSI->options_).recursion_depth = iVar2 + -1;
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
    absl::lts_20240722::Status::~Status((Status *)this);
    literal_02._M_str = "]";
    literal_02._M_len = 1;
    bVar4 = Peek(in_RSI,literal_02);
    if (!bVar4) {
      local_100 = "expected \',\'";
      do {
        SkipValue(this);
        if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002bf57d;
        literal_03._M_str = ",";
        literal_03._M_len = 1;
        bVar4 = Peek(in_RSI,literal_03);
        literal_04._M_str = "]";
        literal_04._M_len = 1;
        bVar5 = Peek(in_RSI,literal_04);
        if (bVar5) {
          if ((!bVar4) || ((in_RSI->options_).allow_legacy_syntax != false)) goto LAB_002bf4e4;
          local_100 = "expected \']\'";
          break;
        }
      } while (bVar4);
LAB_002bf564:
      JsonLocation::Invalid((JsonLocation *)this,&in_RSI->json_loc_,0xc,local_100);
      goto LAB_002bf57d;
    }
LAB_002bf4e4:
    piVar1 = &(in_RSI->options_).recursion_depth;
    *piVar1 = *piVar1 + 1;
LAB_002bf4e8:
    (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    goto LAB_002bf57d;
  case 2:
    ParseUtf8((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               *)&local_e0[0].status_,in_RSI);
    if (local_e0[0] ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    else {
      (this->stream_).stream_ = (ZeroCopyInputStream *)local_e0[0];
      local_e0[0] = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x37;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_e0[0].status_);
    goto LAB_002bf57d;
  case 3:
    ParseNumber((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)
                &local_e0[0].status_,in_RSI);
    if (local_e0[0] ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    else {
      (this->stream_).stream_ = (ZeroCopyInputStream *)local_e0[0];
      local_e0[0] = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x37;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)
               &local_e0[0].status_);
    goto LAB_002bf57d;
  case 4:
    break;
  case 5:
    break;
  case 6:
    break;
  default:
    goto switchD_002bf18f_default;
  }
  Expect(this);
LAB_002bf57d:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_f8.status_);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLexer::SkipValue() {
  absl::StatusOr<Kind> kind = PeekKind();
  RETURN_IF_ERROR(kind.status());

  switch (*kind) {
    case JsonLexer::kObj:
      return VisitObject(
          [this](LocationWith<MaybeOwnedString>&) { return SkipValue(); });
    case JsonLexer::kArr:
      return VisitArray([this] { return SkipValue(); });
    case JsonLexer::kStr:
      return ParseUtf8().status();
    case JsonLexer::kNum:
      return ParseNumber().status();
    case JsonLexer::kTrue:
      return Expect("true");
    case JsonLexer::kFalse:
      return Expect("false");
    case JsonLexer::kNull:
      return Expect("null");
    default:
      break;
  }
  // Some compilers seem to fail to realize this is a basic block
  // terminator and incorrectly believe this function is missing
  // a return.
  ABSL_CHECK(false) << "unreachable";
  return absl::OkStatus();
}